

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool saveToFile<float>(string *fname,TWaveformT<float> *waveform)

{
  byte bVar1;
  size_type sVar2;
  float *pfVar3;
  vector<float,_std::allocator<float>_> *in_RSI;
  string *in_RDI;
  unsigned_long totalSize_bytes;
  ofstream fout;
  float local_238;
  char local_218 [512];
  vector<float,_std::allocator<float>_> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::ofstream::ofstream(local_218,in_RDI,_S_bin);
  bVar1 = std::ios::good();
  local_1 = (bVar1 & 1) != 0;
  if ((bool)local_1) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size(local_18);
    pfVar3 = std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)0x173b0a);
    std::ostream::write(local_218,(long)pfVar3);
    std::ofstream::close();
    local_238 = (float)(sVar2 << 2);
    printf("Total data saved: %g MB\n",(double)(local_238 * 0.0009765625 * 0.0009765625));
  }
  std::ofstream::~ofstream(local_218);
  return (bool)(local_1 & 1);
}

Assistant:

bool saveToFile(const std::string & fname, TWaveformT<TSample> & waveform) {
    static_assert(std::is_same<TSample, TSampleF>::value, "Sample type not supported");

    std::ofstream fout(fname, std::ios::binary);
    if (fout.good() == false) {
        return false;
    }

    auto totalSize_bytes = sizeof(TSample)*waveform.size();

    fout.write((char *)(waveform.data()), totalSize_bytes);
    fout.close();

    printf("Total data saved: %g MB\n", ((float)(totalSize_bytes)/1024.0f/1024.0f));

    return true;
}